

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deco.h
# Opt level: O0

Dec_Edge_t Dec_GraphAddNodeOr(Dec_Graph_t *pGraph,Dec_Edge_t eEdge0,Dec_Edge_t eEdge1)

{
  Dec_Edge_t DVar1;
  Dec_Node_t *pDVar2;
  Dec_Node_t *pNode;
  Dec_Graph_t *pGraph_local;
  Dec_Edge_t eEdge1_local;
  Dec_Edge_t eEdge0_local;
  
  pDVar2 = Dec_GraphAppendNode(pGraph);
  pDVar2->eEdge0 = eEdge0;
  pDVar2->eEdge1 = eEdge1;
  *(uint *)&pDVar2->field_0x10 =
       *(uint *)&pDVar2->field_0x10 & 0xffff7fff | ((uint)eEdge0 & 1) << 0xf;
  *(uint *)&pDVar2->field_0x10 =
       *(uint *)&pDVar2->field_0x10 & 0xfffeffff | ((uint)eEdge1 & 1) << 0x10;
  *(uint *)&pDVar2->field_0x10 = *(uint *)&pDVar2->field_0x10 & 0xffffbfff | 0x4000;
  pDVar2->eEdge0 =
       (Dec_Edge_t)((uint)pDVar2->eEdge0 & 0xfffffffe | (uint)(((uint)pDVar2->eEdge0 & 1) == 0));
  pDVar2->eEdge1 =
       (Dec_Edge_t)((uint)pDVar2->eEdge1 & 0xfffffffe | (uint)(((uint)pDVar2->eEdge1 & 1) == 0));
  DVar1 = Dec_EdgeCreate(pGraph->nSize + -1,1);
  return DVar1;
}

Assistant:

static inline Dec_Edge_t Dec_GraphAddNodeOr( Dec_Graph_t * pGraph, Dec_Edge_t eEdge0, Dec_Edge_t eEdge1 )
{
    Dec_Node_t * pNode;
    // get the new node
    pNode = Dec_GraphAppendNode( pGraph );
    // set the inputs and other info
    pNode->eEdge0 = eEdge0;
    pNode->eEdge1 = eEdge1;
    pNode->fCompl0 = eEdge0.fCompl;
    pNode->fCompl1 = eEdge1.fCompl;
    // make adjustments for the OR gate
    pNode->fNodeOr = 1;
    pNode->eEdge0.fCompl = !pNode->eEdge0.fCompl;
    pNode->eEdge1.fCompl = !pNode->eEdge1.fCompl;
    return Dec_EdgeCreate( pGraph->nSize - 1, 1 );
}